

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O3

SpatialForceVector * __thiscall
iDynTree::Position::changePointOf(Position *this,SpatialForceVector *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  SpatialForceVector *result;
  SpatialForceVector *in_RDI;
  
  in_RDI->_vptr_SpatialForceVector = (_func_int **)&PTR__SpatialForceVector_0015ec98;
  dVar3 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [0];
  dVar4 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [1];
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[0] =
       dVar3;
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[1] =
       dVar4;
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data
          [2];
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).linearVec3.super_Vector3.m_data[2] =
       dVar1;
  dVar2 = (this->super_Vector3).m_data[0];
  dVar5 = (this->super_Vector3).m_data[1];
  dVar6 = (this->super_Vector3).m_data[2];
  dVar7 = (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.
          m_data[1];
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[0] =
       (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data
       [0] + (dVar1 * dVar5 - dVar4 * dVar6);
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[1] =
       dVar7 + (dVar3 * dVar6 - dVar1 * dVar2);
  (in_RDI->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data[2] =
       (dVar4 * dVar2 - dVar3 * dVar5) +
       (other->super_SpatialVector<iDynTree::SpatialForceVector>).angularVec3.super_Vector3.m_data
       [2];
  return in_RDI;
}

Assistant:

SpatialForceVector Position::changePointOf(const SpatialForceVector & other) const
    {
        SpatialForceVector result;

        Eigen::Map<const Eigen::Vector3d> thisPos(this->data());
        Eigen::Map<const Eigen::Vector3d> otherLinear(other.getLinearVec3().data());
        Eigen::Map<const Eigen::Vector3d> otherAngular(other.getAngularVec3().data());
        Eigen::Map<Eigen::Vector3d> resLinear(result.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> resAngular(result.getAngularVec3().data());

        resLinear  = otherLinear;
        resAngular = thisPos.cross(otherLinear) + otherAngular;

        return result;
    }